

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ConnectBlock
          (Chainstate *this,CBlock *block,BlockValidationState *state,CBlockIndex *pindex,
          CCoinsViewCache *view,bool fJustCheck)

{
  int64_t *piVar1;
  duration *pdVar2;
  long lVar3;
  pointer ptVar4;
  pointer ptVar5;
  CChainParams *consensusParams;
  Notifications *notifications;
  BlockManager *pBVar6;
  pointer psVar7;
  element_type *peVar8;
  CTransaction *this_00;
  pointer pCVar9;
  pointer pCVar10;
  pointer pCVar11;
  uint flags;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint flags_00;
  long lVar17;
  base_blob<256U> *this_01;
  uint256 *__k;
  iterator iVar18;
  CBlockIndex *pCVar19;
  base_uint<256U> *b;
  int64_t iVar20;
  long lVar21;
  Coin *pCVar22;
  long lVar23;
  CAmount CVar24;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks;
  CTxUndo *txundo;
  pointer psVar25;
  long lVar26;
  size_t j;
  ulong uVar27;
  CCheckQueue<CScriptCheck> *pqueueIn;
  uint uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  double dVar30;
  undefined1 auVar31 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  ulong local_1d8;
  int local_1b0;
  double local_198;
  uint local_18c;
  CAmount txfee;
  pointer pCStack_180;
  pointer local_178;
  vector<int,_std::allocator<int>_> prevheights;
  vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> txsdata;
  CBlockUndo blockundo;
  CBlockIndex *pindex_local;
  CCheckQueueControl<CScriptCheck> control;
  CAmount blockReward;
  CTxUndo undoDummy;
  undefined1 auStack_d0 [16];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_98;
  base_blob<256U> local_78;
  uint256 block_hash;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pindex_local = pindex;
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x967,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  CBlockHeader::GetHash((uint256 *)&block_hash.super_base_blob<256U>,&block->super_CBlockHeader);
  bVar12 = ::operator==(&pindex->phashBlock->super_base_blob<256U>,&block_hash.super_base_blob<256U>
                       );
  if (!bVar12) {
    __assert_fail("*pindex->phashBlock == block_hash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x96a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  ptVar4 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar5 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar17 = std::chrono::_V2::steady_clock::now();
  consensusParams = (this->m_chainman->m_options).chainparams;
  bVar12 = CheckBlock(block,state,&consensusParams->consensus,!fJustCheck,!fJustCheck);
  if (!bVar12) {
    if ((state->super_ValidationState<BlockValidationResult>).m_result == BLOCK_MUTATED) {
      notifications = (this->m_chainman->m_options).notifications;
      _((bilingual_str *)&undoDummy,(ConstevalStringLiteral)0x6c3767);
      bVar12 = FatalError(notifications,state,(bilingual_str *)&undoDummy);
      bilingual_str::~bilingual_str((bilingual_str *)&undoDummy);
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)&undoDummy,&state->super_ValidationState<BlockValidationResult>);
      logging_function._M_str = "ConnectBlock";
      logging_function._M_len = 0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<char[13],std::__cxx11::string>
                (logging_function,source_file,0x984,ALL,Error,(ConstevalFormatString<2U>)0x6c37af,
                 (char (*) [13])"ConnectBlock",(string *)&undoDummy);
      std::__cxx11::string::~string((string *)&undoDummy);
      bVar12 = false;
    }
    goto LAB_0035e339;
  }
  if (pindex->pprev == (CBlockIndex *)0x0) {
    local_78.m_data._M_elems[0x10] = '\0';
    local_78.m_data._M_elems[0x11] = '\0';
    local_78.m_data._M_elems[0x12] = '\0';
    local_78.m_data._M_elems[0x13] = '\0';
    local_78.m_data._M_elems[0x14] = '\0';
    local_78.m_data._M_elems[0x15] = '\0';
    local_78.m_data._M_elems[0x16] = '\0';
    local_78.m_data._M_elems[0x17] = '\0';
    local_78.m_data._M_elems[0x18] = '\0';
    local_78.m_data._M_elems[0x19] = '\0';
    local_78.m_data._M_elems[0x1a] = '\0';
    local_78.m_data._M_elems[0x1b] = '\0';
    local_78.m_data._M_elems[0x1c] = '\0';
    local_78.m_data._M_elems[0x1d] = '\0';
    local_78.m_data._M_elems[0x1e] = '\0';
    local_78.m_data._M_elems[0x1f] = '\0';
    local_78.m_data._M_elems[0] = '\0';
    local_78.m_data._M_elems[1] = '\0';
    local_78.m_data._M_elems[2] = '\0';
    local_78.m_data._M_elems[3] = '\0';
    local_78.m_data._M_elems[4] = '\0';
    local_78.m_data._M_elems[5] = '\0';
    local_78.m_data._M_elems[6] = '\0';
    local_78.m_data._M_elems[7] = '\0';
    local_78.m_data._M_elems[8] = '\0';
    local_78.m_data._M_elems[9] = '\0';
    local_78.m_data._M_elems[10] = '\0';
    local_78.m_data._M_elems[0xb] = '\0';
    local_78.m_data._M_elems[0xc] = '\0';
    local_78.m_data._M_elems[0xd] = '\0';
    local_78.m_data._M_elems[0xe] = '\0';
    local_78.m_data._M_elems[0xf] = '\0';
  }
  else {
    CBlockIndex::GetBlockHash((uint256 *)&local_78,pindex->pprev);
  }
  (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])
            ((base_blob<256U> *)&undoDummy,view);
  bVar12 = ::operator==(&local_78,(base_blob<256U> *)&undoDummy);
  if (!bVar12) {
    __assert_fail("hashPrevBlock == view.GetBestBlock()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x98a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  piVar1 = &this->m_chainman->num_blocks_total;
  *piVar1 = *piVar1 + 1;
  bVar12 = ::operator==(&block_hash.super_base_blob<256U>,(base_blob<256U> *)consensusParams);
  if (bVar12) {
    bVar12 = true;
    if (!fJustCheck) {
      CBlockIndex::GetBlockHash((uint256 *)&undoDummy,pindex);
      CCoinsViewCache::SetBestBlock(view,(uint256 *)&undoDummy);
    }
    goto LAB_0035e339;
  }
  this_01 = &ChainstateManager::AssumedValidBlock(this->m_chainman)->super_base_blob<256U>;
  bVar12 = base_blob<256U>::IsNull(this_01);
  bVar15 = true;
  if (!bVar12) {
    pBVar6 = this->m_blockman;
    __k = ChainstateManager::AssumedValidBlock(this->m_chainman);
    iVar18 = std::
             _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(pBVar6->m_block_index)._M_h,__k);
    if (iVar18.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur !=
        (__node_type *)0x0) {
      pCVar19 = CBlockIndex::GetAncestor
                          ((CBlockIndex *)
                           ((long)iVar18.
                                  super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                  ._M_cur + 0x28),pindex->nHeight);
      if (pCVar19 == pindex) {
        pCVar19 = CBlockIndex::GetAncestor(this->m_chainman->m_best_header,pindex->nHeight);
        if (pCVar19 == pindex) {
          pCVar19 = this->m_chainman->m_best_header;
          b = &ChainstateManager::MinimumChainWork(this->m_chainman)->super_base_uint<256U>;
          bVar12 = operator>=(&(pCVar19->nChainWork).super_base_uint<256U>,b);
          if (bVar12) {
            pCVar19 = this->m_chainman->m_best_header;
            iVar20 = GetBlockProofEquivalentTime(pCVar19,pindex,pCVar19,&consensusParams->consensus)
            ;
            bVar15 = iVar20 < 0x127501;
          }
        }
      }
    }
  }
  lVar21 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_check;
  pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
  bVar12 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar12) {
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
    dVar30 = (double)(this->m_chainman->time_check).__r;
    local_98._M_dataplus._M_p = (pointer)(dVar30 / 1000000000.0);
    blockReward = (CAmount)((dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    logging_function_00._M_str = "ConnectBlock";
    logging_function_00._M_len = 0xc;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<double,double,double>
              (logging_function_00,source_file_00,0x9ba,BENCH,Debug,
               (ConstevalFormatString<3U>)0x6c37f3,(double *)&undoDummy,(double *)&local_98,
               (double *)&blockReward);
  }
  bVar12 = IsBIP30Repeat(pindex);
  if (pindex->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindex->pprev",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x9ff,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar19 = CBlockIndex::GetAncestor(pindex->pprev,(consensusParams->consensus).BIP34Height);
  if (bVar12) {
LAB_0035d353:
    if (0x1e44d5 < pindex->nHeight) goto LAB_0035d365;
  }
  else {
    if (pCVar19 != (CBlockIndex *)0x0) {
      CBlockIndex::GetBlockHash((uint256 *)&undoDummy,pCVar19);
      bVar12 = ::operator==((base_blob<256U> *)&undoDummy,
                            &(consensusParams->consensus).BIP34Hash.super_base_blob<256U>);
      if (bVar12) goto LAB_0035d353;
    }
LAB_0035d365:
    psVar7 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar25 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar25 != psVar7;
        psVar25 = psVar25 + 1) {
      uVar29 = 0;
      while( true ) {
        peVar8 = (psVar25->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        lVar17 = (long)(peVar8->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(peVar8->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((ulong)(lVar17 / 0x28) <= uVar29) break;
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)(peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_finish =
             *(pointer *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        auStack_d0._0_8_ =
             *(undefined8 *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        auStack_d0._8_4_ = (undefined4)uVar29;
        iVar16 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                           (view,&undoDummy,lVar17 % 0x28);
        uVar29 = uVar29 + 1;
        if ((char)iVar16 != '\0') {
          logging_function_01._M_str = "ConnectBlock";
          logging_function_01._M_len = 0xc;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          LogPrintFormatInternal<>
                    (logging_function_01,source_file_01,0xa0b,ALL,Info,
                     (ConstevalFormatString<0U>)0x6c3825);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&undoDummy,"bad-txns-BIP30",(allocator<char> *)&blockReward);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"",(allocator<char> *)&blockundo);
          bVar12 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              (string *)&undoDummy,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&undoDummy);
          goto LAB_0035e339;
        }
      }
    }
  }
  bVar12 = DeploymentActiveAt<Consensus::BuriedDeployment>(pindex,this->m_chainman,DEPLOYMENT_CSV);
  flags_00 = GetBlockScriptFlags(pindex,this->m_chainman);
  lVar17 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_forks;
  pdVar2->__r = pdVar2->__r + (lVar17 - lVar21);
  bVar13 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar13) {
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)(lVar17 - lVar21) / 1000000.0);
    dVar30 = (double)(this->m_chainman->time_forks).__r;
    local_98._M_dataplus._M_p = (pointer)(dVar30 / 1000000000.0);
    blockReward = (CAmount)((dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    logging_function_02._M_str = "ConnectBlock";
    logging_function_02._M_len = 0xc;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_02._M_len = 0x5e;
    LogPrintFormatInternal<double,double,double>
              (logging_function_02,source_file_02,0xa20,BENCH,Debug,
               (ConstevalFormatString<3U>)0x6c386b,(double *)&undoDummy,(double *)&local_98,
               (double *)&blockReward);
  }
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pqueueIn = &this->m_chainman->m_script_check_queue;
  if (!bVar15) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  if (ptVar4 == ptVar5) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  CCheckQueueControl<CScriptCheck>::CCheckQueueControl(&control,pqueueIn);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::vector
            (&txsdata,(long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,
             (allocator_type *)&undoDummy);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve
            (&blockundo.vtxundo,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  flags = (uint)bVar12;
  pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0;
  if (ptVar4 != ptVar5) {
    pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&txfee;
  }
  local_1d8 = 0;
  uVar28 = 0;
  lVar21 = 0;
  iVar16 = 0;
  while( true ) {
    uVar29 = (ulong)uVar28;
    psVar25 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar25 >> 4) <= uVar29)
    break;
    this_00 = psVar25[uVar29].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    pCVar9 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar10 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar13 = CTransaction::IsCoinBase(this_00);
    if (!bVar13) {
      txfee = 0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_d0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_d0._0_8_ = auStack_d0._0_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &local_b0;
      local_c0._8_8_ = 0;
      local_b0._M_local_buf[0] = '\0';
      bVar13 = Consensus::CheckTxInputs
                         (this_00,(TxValidationState *)&undoDummy,view,pindex->nHeight,&txfee);
      if (bVar13) {
        local_1d8 = local_1d8 + txfee;
        if (local_1d8 < 0x775f05a074001) {
          std::vector<int,_std::allocator<int>_>::resize
                    (&prevheights,
                     ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x68);
          lVar26 = 0;
          uVar27 = 0;
          while( true ) {
            pCVar11 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pCVar11) / 0x68) <=
                uVar27) break;
            pCVar22 = CCoinsViewCache::AccessCoin
                                (view,(COutPoint *)
                                      ((pCVar11->prevout).hash.m_wrapped.super_base_blob<256U>.
                                       m_data._M_elems + lVar26));
            prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar27] = *(uint *)&pCVar22->field_0x28 >> 1;
            uVar27 = uVar27 + 1;
            lVar26 = lVar26 + 0x68;
          }
          bVar14 = SequenceLocks(this_00,flags,&prevheights,pindex);
          bVar13 = true;
          if (bVar14) goto LAB_0035d9b8;
          logging_function_05._M_str = "ConnectBlock";
          logging_function_05._M_len = 0xc;
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_05._M_len = 0x5e;
          LogPrintFormatInternal<char[13]>
                    (logging_function_05,source_file_05,0xa51,ALL,Info,
                     (ConstevalFormatString<1U>)0x6c391c,(char (*) [13])"ConnectBlock");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"bad-txns-nonfinal",(allocator<char> *)&local_198);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blockReward,"",(allocator<char> *)&local_18c);
          bVar12 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              &local_98,(string *)&blockReward);
        }
        else {
          logging_function_04._M_str = "ConnectBlock";
          logging_function_04._M_len = 0xc;
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_04._M_len = 0x5e;
          LogPrintFormatInternal<char[13]>
                    (logging_function_04,source_file_04,0xa44,ALL,Info,
                     (ConstevalFormatString<1U>)0x6c38c1,(char (*) [13])"ConnectBlock");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"bad-txns-accumulated-fee-outofrange",
                     (allocator<char> *)&local_198);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blockReward,"",(allocator<char> *)&local_18c);
          bVar12 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              &local_98,(string *)&blockReward);
        }
        std::__cxx11::string::~string((string *)&blockReward);
        std::__cxx11::string::~string((string *)&local_98);
        bVar13 = false;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::__cxx11::string::string
                  ((string *)&blockReward,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
        ValidationState<BlockValidationResult>::Invalid
                  (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,&local_98,
                   (string *)&blockReward);
        std::__cxx11::string::~string((string *)&blockReward);
        std::__cxx11::string::~string((string *)&local_98);
        base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&this_00->hash);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>);
        logging_function_03._M_str = "ConnectBlock";
        logging_function_03._M_len = 0xc;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x5e;
        LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_03,source_file_03,0xa3f,ALL,Error,
                   (ConstevalFormatString<3U>)0x6c389b,(char (*) [13])"ConnectBlock",&local_98,
                   (string *)&blockReward);
        std::__cxx11::string::~string((string *)&blockReward);
        std::__cxx11::string::~string((string *)&local_98);
        bVar13 = false;
        bVar12 = false;
      }
LAB_0035d9b8:
      ValidationState<TxValidationResult>::~ValidationState
                ((ValidationState<TxValidationResult> *)&undoDummy);
      if (!bVar13) goto LAB_0035e305;
    }
    iVar20 = GetTransactionSigOpCost(this_00,view,flags_00);
    lVar21 = lVar21 + iVar20;
    if (80000 < lVar21) {
      logging_function_09._M_str = "ConnectBlock";
      logging_function_09._M_len = 0xc;
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_09._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function_09,source_file_09,0xa5c,ALL,Info,
                 (ConstevalFormatString<0U>)0x6c3961);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&undoDummy,"bad-blk-sigops",(allocator<char> *)&blockReward);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"",(allocator<char> *)&txfee);
      bVar12 = ValidationState<BlockValidationResult>::Invalid
                         (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                          (string *)&undoDummy,&local_98);
      goto LAB_0035e2e9;
    }
    bVar13 = CTransaction::IsCoinBase(this_00);
    if (!bVar13) {
      local_178 = (pointer)0x0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_d0;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_d0._0_8_ = auStack_d0._0_8_ & 0xffffffffffffff00;
      local_c0._0_8_ = &local_b0;
      local_c0._8_8_ = 0;
      txfee = 0;
      pCStack_180 = (pointer)0x0;
      local_b0._M_local_buf[0] = '\0';
      if (bVar15) {
        bVar13 = CheckInputScripts(this_00,(TxValidationState *)&undoDummy,view,flags_00,fJustCheck,
                                   fJustCheck,
                                   txsdata.
                                   super__Vector_base<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar29,
                                   &this->m_chainman->m_validation_cache,pvChecks);
        if (bVar13) goto LAB_0035dabf;
        std::__cxx11::string::string
                  ((string *)&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::__cxx11::string::string
                  ((string *)&blockReward,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
        ValidationState<BlockValidationResult>::Invalid
                  (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,&local_98,
                   (string *)&blockReward);
        std::__cxx11::string::~string((string *)&blockReward);
        std::__cxx11::string::~string((string *)&local_98);
        base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&this_00->hash);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>);
        logging_function_06._M_str = "ConnectBlock";
        logging_function_06._M_len = 0xc;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_06._M_len = 0x5e;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_06,source_file_06,0xa6a,ALL,Error,
                   (ConstevalFormatString<2U>)0x6c3998,&local_98,(string *)&blockReward);
        std::__cxx11::string::~string((string *)&blockReward);
        std::__cxx11::string::~string((string *)&local_98);
        bVar13 = false;
        bVar12 = false;
      }
      else {
LAB_0035dabf:
        bVar13 = true;
        CCheckQueueControl<CScriptCheck>::Add
                  (&control,(vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&txfee);
      }
      ValidationState<TxValidationResult>::~ValidationState
                ((ValidationState<TxValidationResult> *)&undoDummy);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&txfee);
      if (!bVar13) goto LAB_0035e305;
    }
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    txundo = &undoDummy;
    if (uVar29 != 0) {
      std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>(&blockundo.vtxundo);
      txundo = blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
    }
    UpdateCoins(this_00,view,txundo,pindex->nHeight);
    local_1b0 = (int)(((long)pCVar9 - (long)pCVar10) / 0x68);
    iVar16 = iVar16 + local_1b0;
    std::vector<Coin,_std::allocator<Coin>_>::~vector(&undoDummy.vprevout);
    uVar28 = uVar28 + 1;
  }
  lVar21 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_connect;
  pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
  bVar12 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar12) {
    lVar26 = (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar23 = lVar26 >> 4;
    local_18c = (uint)lVar23;
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
    auVar31._8_4_ = (int)(lVar26 >> 0x24);
    auVar31._0_8_ = lVar23;
    auVar31._12_4_ = 0x45300000;
    local_98._M_dataplus._M_p =
         (pointer)((double)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                           _M_impl.super__Vector_impl_data._M_start /
                  ((auVar31._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,local_18c) - 4503599627370496.0)));
    blockReward = 0;
    if (1 < iVar16) {
      blockReward = (CAmount)((double)undoDummy.vprevout.
                                      super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                                      super__Vector_impl_data._M_start / (double)(iVar16 + -1));
    }
    dVar30 = (double)(this->m_chainman->time_connect).__r;
    txfee = (CAmount)(dVar30 / 1000000000.0);
    local_198 = (dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
    logging_function_07._M_str = "ConnectBlock";
    logging_function_07._M_len = 0xc;
    source_file_07._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_07._M_len = 0x5e;
    LogPrintFormatInternal<unsigned_int,double,double,double,double,double>
              (logging_function_07,source_file_07,0xa7c,BENCH,Debug,
               (ConstevalFormatString<6U>)0x6c39d0,&local_18c,(double *)&undoDummy,
               (double *)&local_98,(double *)&blockReward,(double *)&txfee,&local_198);
  }
  lVar21 = (long)pindex->nHeight / (long)(consensusParams->consensus).nSubsidyHalvingInterval;
  uVar29 = 0;
  if ((int)lVar21 < 0x40) {
    uVar29 = 5000000000 >> ((byte)lVar21 & 0x3f);
  }
  blockReward = uVar29 + local_1d8;
  CVar24 = CTransaction::GetValueOut
                     ((((block->vtx).
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((long)(uVar29 + local_1d8) < CVar24) {
    undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CTransaction::GetValueOut
                            ((((block->vtx).
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    logging_function_08._M_str = "ConnectBlock";
    logging_function_08._M_len = 0xc;
    source_file_08._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_08._M_len = 0x5e;
    LogPrintFormatInternal<long,long>
              (logging_function_08,source_file_08,0xa80,ALL,Info,(ConstevalFormatString<2U>)0x6c3a27
               ,(long *)&undoDummy,&blockReward);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&undoDummy,"bad-cb-amount",(allocator<char> *)&txfee);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"",(allocator<char> *)&local_198);
    bVar12 = ValidationState<BlockValidationResult>::Invalid
                       (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                        (string *)&undoDummy,&local_98);
LAB_0035e2e9:
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&undoDummy);
  }
  else {
    bVar12 = CCheckQueueControl<CScriptCheck>::Wait(&control);
    if (!bVar12) {
      logging_function_13._M_str = "ConnectBlock";
      logging_function_13._M_len = 0xc;
      source_file_13._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_13._M_len = 0x5e;
      LogPrintFormatInternal<char[13]>
                (logging_function_13,source_file_13,0xa85,ALL,Info,
                 (ConstevalFormatString<1U>)0x6c3a7c,(char (*) [13])"ConnectBlock");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&undoDummy,"block-validation-failed",(allocator<char> *)&txfee);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"",(allocator<char> *)&local_198);
      bVar12 = ValidationState<BlockValidationResult>::Invalid
                         (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                          (string *)&undoDummy,&local_98);
      goto LAB_0035e2e9;
    }
    lVar21 = std::chrono::_V2::steady_clock::now();
    pdVar2 = &this->m_chainman->time_verify;
    pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
    bVar12 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar12) {
      local_18c = iVar16 - 1;
      undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
      local_98._M_dataplus._M_p = (pointer)0x0;
      if (1 < iVar16) {
        local_98._M_dataplus._M_p =
             (pointer)((double)undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>.
                               _M_impl.super__Vector_impl_data._M_start / (double)(int)local_18c);
      }
      dVar30 = (double)(this->m_chainman->time_verify).__r;
      txfee = (CAmount)(dVar30 / 1000000000.0);
      local_198 = (dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      logging_function_10._M_str = "ConnectBlock";
      logging_function_10._M_len = 0xc;
      source_file_10._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_10._M_len = 0x5e;
      LogPrintFormatInternal<int,double,double,double,double>
                (logging_function_10,source_file_10,0xa8e,BENCH,Debug,
                 (ConstevalFormatString<5U>)0x6c3ab2,(int *)&local_18c,(double *)&undoDummy,
                 (double *)&local_98,(double *)&txfee,&local_198);
    }
    bVar12 = true;
    if (!fJustCheck) {
      bVar15 = ::node::BlockManager::WriteUndoDataForBlock(this->m_blockman,&blockundo,state,pindex)
      ;
      if (bVar15) {
        lVar17 = std::chrono::_V2::steady_clock::now();
        pdVar2 = &this->m_chainman->time_undo;
        pdVar2->__r = pdVar2->__r + (lVar17 - lVar21);
        bVar15 = ::LogAcceptCategory(BENCH,Debug);
        if (bVar15) {
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((double)(lVar17 - lVar21) / 1000000.0);
          dVar30 = (double)(this->m_chainman->time_undo).__r;
          local_98._M_dataplus._M_p = (pointer)(dVar30 / 1000000000.0);
          txfee = (CAmount)((dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          logging_function_11._M_str = "ConnectBlock";
          logging_function_11._M_len = 0xc;
          source_file_11._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_11._M_len = 0x5e;
          LogPrintFormatInternal<double,double,double>
                    (logging_function_11,source_file_11,0xa9c,BENCH,Debug,
                     (ConstevalFormatString<3U>)0x6c3af4,(double *)&undoDummy,(double *)&local_98,
                     (double *)&txfee);
        }
        if ((pindex->nStatus & 0x60) != 0 || (pindex->nStatus & 7) < 5) {
          CBlockIndex::RaiseValidity(pindex,BLOCK_VALID_SCRIPTS);
          std::
          _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
          ::_M_insert_unique<CBlockIndex*const&>
                    ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                      *)&this->m_blockman->m_dirty_blockindex,&pindex_local);
          pindex = pindex_local;
        }
        CBlockIndex::GetBlockHash((uint256 *)&undoDummy,pindex);
        CCoinsViewCache::SetBestBlock(view,(uint256 *)&undoDummy);
        lVar21 = std::chrono::_V2::steady_clock::now();
        pdVar2 = &this->m_chainman->time_index;
        pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
        bVar15 = ::LogAcceptCategory(BENCH,Debug);
        if (bVar15) {
          undoDummy.vprevout.super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
          dVar30 = (double)(this->m_chainman->time_index).__r;
          local_98._M_dataplus._M_p = (pointer)(dVar30 / 1000000000.0);
          txfee = (CAmount)((dVar30 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          logging_function_12._M_str = "ConnectBlock";
          logging_function_12._M_len = 0xc;
          source_file_12._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_12._M_len = 0x5e;
          LogPrintFormatInternal<double,double,double>
                    (logging_function_12,source_file_12,0xaab,BENCH,Debug,
                     (ConstevalFormatString<3U>)0x6c3b28,(double *)&undoDummy,(double *)&local_98,
                     (double *)&txfee);
        }
      }
      else {
        bVar12 = false;
      }
    }
  }
LAB_0035e305:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prevheights.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::~vector
            (&txsdata);
  CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&control);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockundo.vtxundo);
LAB_0035e339:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectBlock(const CBlock& block, BlockValidationState& state, CBlockIndex* pindex,
                               CCoinsViewCache& view, bool fJustCheck)
{
    AssertLockHeld(cs_main);
    assert(pindex);

    uint256 block_hash{block.GetHash()};
    assert(*pindex->phashBlock == block_hash);
    const bool parallel_script_checks{m_chainman.GetCheckQueue().HasThreads()};

    const auto time_start{SteadyClock::now()};
    const CChainParams& params{m_chainman.GetParams()};

    // Check it again in case a previous version let a bad block in
    // NOTE: We don't currently (re-)invoke ContextualCheckBlock() or
    // ContextualCheckBlockHeader() here. This means that if we add a new
    // consensus rule that is enforced in one of those two functions, then we
    // may have let in a block that violates the rule prior to updating the
    // software, and we would NOT be enforcing the rule here. Fully solving
    // upgrade from one software version to the next after a consensus rule
    // change is potentially tricky and issue-specific (see NeedsRedownload()
    // for one approach that was used for BIP 141 deployment).
    // Also, currently the rule against blocks more than 2 hours in the future
    // is enforced in ContextualCheckBlockHeader(); we wouldn't want to
    // re-enforce that rule here (at least until we make it impossible for
    // the clock to go backward).
    if (!CheckBlock(block, state, params.GetConsensus(), !fJustCheck, !fJustCheck)) {
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED) {
            // We don't write down blocks to disk if they may have been
            // corrupted, so this should be impossible unless we're having hardware
            // problems.
            return FatalError(m_chainman.GetNotifications(), state, _("Corrupt block found indicating potential hardware failure."));
        }
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }

    // verify that the view's current state corresponds to the previous block
    uint256 hashPrevBlock = pindex->pprev == nullptr ? uint256() : pindex->pprev->GetBlockHash();
    assert(hashPrevBlock == view.GetBestBlock());

    m_chainman.num_blocks_total++;

    // Special case for the genesis block, skipping connection of its transactions
    // (its coinbase is unspendable)
    if (block_hash == params.GetConsensus().hashGenesisBlock) {
        if (!fJustCheck)
            view.SetBestBlock(pindex->GetBlockHash());
        return true;
    }

    bool fScriptChecks = true;
    if (!m_chainman.AssumedValidBlock().IsNull()) {
        // We've been configured with the hash of a block which has been externally verified to have a valid history.
        // A suitable default value is included with the software and updated from time to time.  Because validity
        //  relative to a piece of software is an objective fact these defaults can be easily reviewed.
        // This setting doesn't force the selection of any particular chain but makes validating some faster by
        //  effectively caching the result of part of the verification.
        BlockMap::const_iterator it{m_blockman.m_block_index.find(m_chainman.AssumedValidBlock())};
        if (it != m_blockman.m_block_index.end()) {
            if (it->second.GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->nChainWork >= m_chainman.MinimumChainWork()) {
                // This block is a member of the assumed verified chain and an ancestor of the best header.
                // Script verification is skipped when connecting blocks under the
                // assumevalid block. Assuming the assumevalid block is valid this
                // is safe because block merkle hashes are still computed and checked,
                // Of course, if an assumed valid block is invalid due to false scriptSigs
                // this optimization would allow an invalid chain to be accepted.
                // The equivalent time check discourages hash power from extorting the network via DOS attack
                //  into accepting an invalid block through telling users they must manually set assumevalid.
                //  Requiring a software change or burying the invalid block, regardless of the setting, makes
                //  it hard to hide the implication of the demand.  This also avoids having release candidates
                //  that are hardly doing any signature verification at all in testing without having to
                //  artificially set the default assumed verified block further back.
                // The test against the minimum chain work prevents the skipping when denied access to any chain at
                //  least as good as the expected chain.
                fScriptChecks = (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, params.GetConsensus()) <= 60 * 60 * 24 * 7 * 2);
            }
        }
    }

    const auto time_1{SteadyClock::now()};
    m_chainman.time_check += time_1 - time_start;
    LogDebug(BCLog::BENCH, "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_1 - time_start),
             Ticks<SecondsDouble>(m_chainman.time_check),
             Ticks<MillisecondsDouble>(m_chainman.time_check) / m_chainman.num_blocks_total);

    // Do not allow blocks that contain transactions which 'overwrite' older transactions,
    // unless those are already completely spent.
    // If such overwrites are allowed, coinbases and transactions depending upon those
    // can be duplicated to remove the ability to spend the first instance -- even after
    // being sent to another address.
    // See BIP30, CVE-2012-1909, and http://r6.ca/blog/20120206T005236Z.html for more information.
    // This rule was originally applied to all blocks with a timestamp after March 15, 2012, 0:00 UTC.
    // Now that the whole chain is irreversibly beyond that time it is applied to all blocks except the
    // two in the chain that violate it. This prevents exploiting the issue against nodes during their
    // initial block download.
    bool fEnforceBIP30 = !IsBIP30Repeat(*pindex);

    // Once BIP34 activated it was not possible to create new duplicate coinbases and thus other than starting
    // with the 2 existing duplicate coinbase pairs, not possible to create overwriting txs.  But by the
    // time BIP34 activated, in each of the existing pairs the duplicate coinbase had overwritten the first
    // before the first had been spent.  Since those coinbases are sufficiently buried it's no longer possible to create further
    // duplicate transactions descending from the known pairs either.
    // If we're on the known chain at height greater than where BIP34 activated, we can save the db accesses needed for the BIP30 check.

    // BIP34 requires that a block at height X (block X) has its coinbase
    // scriptSig start with a CScriptNum of X (indicated height X).  The above
    // logic of no longer requiring BIP30 once BIP34 activates is flawed in the
    // case that there is a block X before the BIP34 height of 227,931 which has
    // an indicated height Y where Y is greater than X.  The coinbase for block
    // X would also be a valid coinbase for block Y, which could be a BIP30
    // violation.  An exhaustive search of all mainnet coinbases before the
    // BIP34 height which have an indicated height greater than the block height
    // reveals many occurrences. The 3 lowest indicated heights found are
    // 209,921, 490,897, and 1,983,702 and thus coinbases for blocks at these 3
    // heights would be the first opportunity for BIP30 to be violated.

    // The search reveals a great many blocks which have an indicated height
    // greater than 1,983,702, so we simply remove the optimization to skip
    // BIP30 checking for blocks at height 1,983,702 or higher.  Before we reach
    // that block in another 25 years or so, we should take advantage of a
    // future consensus change to do a new and improved version of BIP34 that
    // will actually prevent ever creating any duplicate coinbases in the
    // future.
    static constexpr int BIP34_IMPLIES_BIP30_LIMIT = 1983702;

    // There is no potential to create a duplicate coinbase at block 209,921
    // because this is still before the BIP34 height and so explicit BIP30
    // checking is still active.

    // The final case is block 176,684 which has an indicated height of
    // 490,897. Unfortunately, this issue was not discovered until about 2 weeks
    // before block 490,897 so there was not much opportunity to address this
    // case other than to carefully analyze it and determine it would not be a
    // problem. Block 490,897 was, in fact, mined with a different coinbase than
    // block 176,684, but it is important to note that even if it hadn't been or
    // is remined on an alternate fork with a duplicate coinbase, we would still
    // not run into a BIP30 violation.  This is because the coinbase for 176,684
    // is spent in block 185,956 in transaction
    // d4f7fbbf92f4a3014a230b2dc70b8058d02eb36ac06b4a0736d9d60eaa9e8781.  This
    // spending transaction can't be duplicated because it also spends coinbase
    // 0328dd85c331237f18e781d692c92de57649529bd5edf1d01036daea32ffde29.  This
    // coinbase has an indicated height of over 4.2 billion, and wouldn't be
    // duplicatable until that height, and it's currently impossible to create a
    // chain that long. Nevertheless we may wish to consider a future soft fork
    // which retroactively prevents block 490,897 from creating a duplicate
    // coinbase. The two historical BIP30 violations often provide a confusing
    // edge case when manipulating the UTXO and it would be simpler not to have
    // another edge case to deal with.

    // testnet3 has no blocks before the BIP34 height with indicated heights
    // post BIP34 before approximately height 486,000,000. After block
    // 1,983,702 testnet3 starts doing unnecessary BIP30 checking again.
    assert(pindex->pprev);
    CBlockIndex* pindexBIP34height = pindex->pprev->GetAncestor(params.GetConsensus().BIP34Height);
    //Only continue to enforce if we're below BIP34 activation height or the block hash at that height doesn't correspond.
    fEnforceBIP30 = fEnforceBIP30 && (!pindexBIP34height || !(pindexBIP34height->GetBlockHash() == params.GetConsensus().BIP34Hash));

    // TODO: Remove BIP30 checking from block height 1,983,702 on, once we have a
    // consensus change that ensures coinbases at those heights cannot
    // duplicate earlier coinbases.
    if (fEnforceBIP30 || pindex->nHeight >= BIP34_IMPLIES_BIP30_LIMIT) {
        for (const auto& tx : block.vtx) {
            for (size_t o = 0; o < tx->vout.size(); o++) {
                if (view.HaveCoin(COutPoint(tx->GetHash(), o))) {
                    LogPrintf("ERROR: ConnectBlock(): tried to overwrite transaction\n");
                    return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-BIP30");
                }
            }
        }
    }

    // Enforce BIP68 (sequence locks)
    int nLockTimeFlags = 0;
    if (DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_CSV)) {
        nLockTimeFlags |= LOCKTIME_VERIFY_SEQUENCE;
    }

    // Get the script flags for this block
    unsigned int flags{GetBlockScriptFlags(*pindex, m_chainman)};

    const auto time_2{SteadyClock::now()};
    m_chainman.time_forks += time_2 - time_1;
    LogDebug(BCLog::BENCH, "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_forks),
             Ticks<MillisecondsDouble>(m_chainman.time_forks) / m_chainman.num_blocks_total);

    CBlockUndo blockundo;

    // Precomputed transaction data pointers must not be invalidated
    // until after `control` has run the script checks (potentially
    // in multiple threads). Preallocate the vector size so a new allocation
    // doesn't invalidate pointers into the vector, and keep txsdata in scope
    // for as long as `control`.
    CCheckQueueControl<CScriptCheck> control(fScriptChecks && parallel_script_checks ? &m_chainman.GetCheckQueue() : nullptr);
    std::vector<PrecomputedTransactionData> txsdata(block.vtx.size());

    std::vector<int> prevheights;
    CAmount nFees = 0;
    int nInputs = 0;
    int64_t nSigOpsCost = 0;
    blockundo.vtxundo.reserve(block.vtx.size() - 1);
    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const CTransaction &tx = *(block.vtx[i]);

        nInputs += tx.vin.size();

        if (!tx.IsCoinBase())
        {
            CAmount txfee = 0;
            TxValidationState tx_state;
            if (!Consensus::CheckTxInputs(tx, tx_state, view, pindex->nHeight, txfee)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                            tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("%s: Consensus::CheckTxInputs: %s, %s\n", __func__, tx.GetHash().ToString(), state.ToString());
                return false;
            }
            nFees += txfee;
            if (!MoneyRange(nFees)) {
                LogPrintf("ERROR: %s: accumulated fee in the block out of range.\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-accumulated-fee-outofrange");
            }

            // Check that transaction is BIP68 final
            // BIP68 lock checks (as opposed to nLockTime checks) must
            // be in ConnectBlock because they require the UTXO set
            prevheights.resize(tx.vin.size());
            for (size_t j = 0; j < tx.vin.size(); j++) {
                prevheights[j] = view.AccessCoin(tx.vin[j].prevout).nHeight;
            }

            if (!SequenceLocks(tx, nLockTimeFlags, prevheights, *pindex)) {
                LogPrintf("ERROR: %s: contains a non-BIP68-final transaction\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal");
            }
        }

        // GetTransactionSigOpCost counts 3 types of sigops:
        // * legacy (always)
        // * p2sh (when P2SH enabled in flags and excludes coinbase)
        // * witness (when witness enabled in flags and excludes coinbase)
        nSigOpsCost += GetTransactionSigOpCost(tx, view, flags);
        if (nSigOpsCost > MAX_BLOCK_SIGOPS_COST) {
            LogPrintf("ERROR: ConnectBlock(): too many sigops\n");
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops");
        }

        if (!tx.IsCoinBase())
        {
            std::vector<CScriptCheck> vChecks;
            bool fCacheResults = fJustCheck; /* Don't cache results if we're actually connecting blocks (still consult the cache, though) */
            TxValidationState tx_state;
            if (fScriptChecks && !CheckInputScripts(tx, tx_state, view, flags, fCacheResults, fCacheResults, txsdata[i], m_chainman.m_validation_cache, parallel_script_checks ? &vChecks : nullptr)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                              tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("ConnectBlock(): CheckInputScripts on %s failed with %s\n",
                    tx.GetHash().ToString(), state.ToString());
                return false;
            }
            control.Add(std::move(vChecks));
        }

        CTxUndo undoDummy;
        if (i > 0) {
            blockundo.vtxundo.emplace_back();
        }
        UpdateCoins(tx, view, i == 0 ? undoDummy : blockundo.vtxundo.back(), pindex->nHeight);
    }
    const auto time_3{SteadyClock::now()};
    m_chainman.time_connect += time_3 - time_2;
    LogDebug(BCLog::BENCH, "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n", (unsigned)block.vtx.size(),
             Ticks<MillisecondsDouble>(time_3 - time_2), Ticks<MillisecondsDouble>(time_3 - time_2) / block.vtx.size(),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_3 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_connect) / m_chainman.num_blocks_total);

    CAmount blockReward = nFees + GetBlockSubsidy(pindex->nHeight, params.GetConsensus());
    if (block.vtx[0]->GetValueOut() > blockReward) {
        LogPrintf("ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n", block.vtx[0]->GetValueOut(), blockReward);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-amount");
    }

    if (!control.Wait()) {
        LogPrintf("ERROR: %s: CheckQueue failed\n", __func__);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "block-validation-failed");
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_verify += time_4 - time_2;
    LogDebug(BCLog::BENCH, "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n", nInputs - 1,
             Ticks<MillisecondsDouble>(time_4 - time_2),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_4 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_verify),
             Ticks<MillisecondsDouble>(m_chainman.time_verify) / m_chainman.num_blocks_total);

    if (fJustCheck)
        return true;

    if (!m_blockman.WriteUndoDataForBlock(blockundo, state, *pindex)) {
        return false;
    }

    const auto time_5{SteadyClock::now()};
    m_chainman.time_undo += time_5 - time_4;
    LogDebug(BCLog::BENCH, "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_undo),
             Ticks<MillisecondsDouble>(m_chainman.time_undo) / m_chainman.num_blocks_total);

    if (!pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
        pindex->RaiseValidity(BLOCK_VALID_SCRIPTS);
        m_blockman.m_dirty_blockindex.insert(pindex);
    }

    // add this block to the view's block chain
    view.SetBestBlock(pindex->GetBlockHash());

    const auto time_6{SteadyClock::now()};
    m_chainman.time_index += time_6 - time_5;
    LogDebug(BCLog::BENCH, "    - Index writing: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_index),
             Ticks<MillisecondsDouble>(m_chainman.time_index) / m_chainman.num_blocks_total);

    TRACE6(validation, block_connected,
        block_hash.data(),
        pindex->nHeight,
        block.vtx.size(),
        nInputs,
        nSigOpsCost,
        time_5 - time_start // in microseconds (µs)
    );

    return true;
}